

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderDragDropTargetRect(ImRect *bb,ImRect *item_clip_rect)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImU32 col;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  ImVec2 local_48;
  ImVec2 IStack_40;
  ImVec4 local_38;
  
  pIVar1 = GImGui->CurrentWindow;
  fVar7 = (item_clip_rect->Min).x;
  fVar8 = (item_clip_rect->Min).y;
  fVar9 = (bb->Min).x;
  fVar10 = (bb->Min).y;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = (bb->Max).x;
  auVar11._4_4_ = (bb->Max).y;
  uVar5 = -(uint)(fVar7 <= fVar9);
  uVar6 = -(uint)(fVar8 <= fVar10);
  uVar13 = CONCAT44(~uVar6 & (uint)fVar8,~uVar5 & (uint)fVar7) |
           CONCAT44((uint)fVar10 & uVar6,(uint)fVar9 & uVar5);
  auVar12._8_8_ = 0;
  auVar12._0_4_ = (item_clip_rect->Max).x;
  auVar12._4_4_ = (item_clip_rect->Max).y;
  auVar12 = minps(auVar11,auVar12);
  local_48.x = (float)uVar13;
  local_48.y = (float)(uVar13 >> 0x20);
  IStack_40.x = auVar12._0_4_;
  IStack_40.y = auVar12._4_4_;
  local_48.x = local_48.x + -3.5;
  local_48.y = local_48.y + -3.5;
  IStack_40.x = IStack_40.x + 3.5;
  IStack_40.y = IStack_40.y + 3.5;
  if (((local_48.x < (pIVar1->ClipRect).Min.x) || (local_48.y < (pIVar1->ClipRect).Min.y)) ||
     ((pIVar1->ClipRect).Max.x < IStack_40.x)) {
    bVar2 = false;
  }
  else {
    bVar2 = IStack_40.y <= (pIVar1->ClipRect).Max.y;
  }
  if (!bVar2) {
    ImDrawList::PushClipRectFullScreen(pIVar1->DrawList);
  }
  this = pIVar1->DrawList;
  local_38.x = (GImGui->Style).Colors[0x33].x;
  local_38.y = (GImGui->Style).Colors[0x33].y;
  uVar3 = (GImGui->Style).Colors[0x33].z;
  uVar4 = (GImGui->Style).Colors[0x33].w;
  local_38.w = (GImGui->Style).Alpha * (float)uVar4;
  local_38.z = (float)uVar3;
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddRect(this,&local_48,&IStack_40,col,0.0,0,2.0);
  if (!bVar2) {
    ImDrawList::PopClipRect(pIVar1->DrawList);
  }
  return;
}

Assistant:

void ImGui::RenderDragDropTargetRect(const ImRect& bb, const ImRect& item_clip_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImRect bb_display = bb;
    bb_display.ClipWith(item_clip_rect); // Clip THEN expand so we have a way to visualize that target is not entirely visible.
    bb_display.Expand(3.5f);
    bool push_clip_rect = !window->ClipRect.Contains(bb_display);
    if (push_clip_rect)
        window->DrawList->PushClipRectFullScreen();
    window->DrawList->AddRect(bb_display.Min, bb_display.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);
    if (push_clip_rect)
        window->DrawList->PopClipRect();
}